

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PPointer * NewPointer(PType *type)

{
  size_t in_RAX;
  PPointer *this;
  size_t bucket;
  size_t local_18;
  
  local_18 = in_RAX;
  this = (PPointer *)
         FTypeTable::FindType
                   (&TypeTable,PPointer::RegistrationInfo.MyClass,(intptr_t)type,0,&local_18);
  if (this == (PPointer *)0x0) {
    this = (PPointer *)
           M_Malloc_Dbg(0x88,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                        ,0x1f7);
    PType::PType((PType *)this,8,8);
    (this->super_PBasicType).super_PType.super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_0086dbf0;
    this->PointedType = type;
    FTypeTable::AddType(&TypeTable,(PType *)this,PPointer::RegistrationInfo.MyClass,(intptr_t)type,0
                        ,local_18);
  }
  return this;
}

Assistant:

PPointer *NewPointer(PType *type)
{
	size_t bucket;
	PType *ptype = TypeTable.FindType(RUNTIME_CLASS(PPointer), (intptr_t)type, 0, &bucket);
	if (ptype == NULL)
	{
		ptype = new PPointer(type);
		TypeTable.AddType(ptype, RUNTIME_CLASS(PPointer), (intptr_t)type, 0, bucket);
	}
	return static_cast<PPointer *>(ptype);
}